

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_checkScalingFactorOneNonBaseUnitImported_Test::TestBody
          (Units_checkScalingFactorOneNonBaseUnitImported_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ImportSourcePtr import;
  UnitsPtr u2;
  UnitsPtr u1;
  UnitsPtr u;
  ModelPtr model;
  AssertionResult local_c0;
  long local_b0 [2];
  long *local_a0;
  long *local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78 [2];
  AssertHelper local_68 [8];
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Model::create();
  psVar1 = local_30;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_40;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_40;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"apples","");
  local_88 = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,(int)&local_c0,1.0,1.0,(string *)0x0);
  if (local_88 != (string *)local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_50;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  libcellml::Units::addUnit((StandardUnit)local_50,0x16,1.0,1.0,(string *)0x0);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_60;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_60;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  libcellml::Units::addUnit((StandardUnit)psVar1,0x16,1.0,1.0,(string *)0x0);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"u","");
  pcVar3 = "";
  local_88 = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"","");
  libcellml::Units::addUnit(local_60,(int)&local_c0,1.0,1.0,(string *)0x0);
  if (local_88 != (string *)local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::ImportSource::create();
  psVar1 = local_88;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_40 + 0x10));
  cVar2 = libcellml::ImportedEntity::isImport();
  local_98 = (long *)CONCAT71(local_98._1_7_,cVar2);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(char *)&local_98,"u->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5b3,(char *)local_c0._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((long *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
    }
    if (local_a0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
      local_a0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98 = (long *)0x0;
  local_a0 = (long *)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_50,(shared_ptr *)&local_60,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_c0,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)&local_98,(double *)&local_a0);
  if ((string)local_c0.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_c0.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_c0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5b4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
      local_98 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_98 = (long *)0x0;
  local_a0 = (long *)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_60,(shared_ptr *)&local_50,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_c0,"0.0","libcellml::Units::scalingFactor(u2, u1)",
             (double *)&local_98,(double *)&local_a0);
  if ((string)local_c0.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_c0.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x5b5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
      local_98 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Units, checkScalingFactorOneNonBaseUnitImported)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u->setImportSource(import);

    EXPECT_TRUE(u->isImport());
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}